

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * icu_63::CollationLoader::loadTailoring(Locale *locale,UErrorCode *errorCode)

{
  int iVar1;
  CollationCacheEntry *pCVar2;
  CollationLoader loader;
  CollationLoader local_230;
  
  pCVar2 = CollationRoot::getRootCacheEntry(errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((*locale->fullName != '\0') && (iVar1 = strcmp(locale->fullName,"root"), iVar1 != 0)) {
      *errorCode = U_ZERO_ERROR;
      CollationLoader(&local_230,pCVar2,locale,errorCode);
      pCVar2 = getCacheEntry(&local_230,errorCode);
      ~CollationLoader(&local_230);
      return pCVar2;
    }
    SharedObject::addRef(&pCVar2->super_SharedObject);
  }
  else {
    pCVar2 = (CollationCacheEntry *)0x0;
  }
  return pCVar2;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadTailoring(const Locale &locale, UErrorCode &errorCode) {
    const CollationCacheEntry *rootEntry = CollationRoot::getRootCacheEntry(errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    const char *name = locale.getName();
    if(*name == 0 || uprv_strcmp(name, "root") == 0) {

        // Have to add a ref.
        rootEntry->addRef();
        return rootEntry;
    }

    // Clear warning codes before loading where they get cached.
    errorCode = U_ZERO_ERROR;
    CollationLoader loader(rootEntry, locale, errorCode);

    // getCacheEntry adds a ref for us.
    return loader.getCacheEntry(errorCode);
}